

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_convert.cpp
# Opt level: O0

Buffer * __thiscall Potassco::StringBuilder::buffer(StringBuilder *this)

{
  byte bVar1;
  Type TVar2;
  StringBuilder *in_RSI;
  Buffer *in_RDI;
  Buffer r;
  StringBuilder *local_20;
  size_t local_18;
  size_t local_10;
  
  TVar2 = type((StringBuilder *)0x26bf72);
  if (TVar2 != Sbo) {
    if (TVar2 == Str) {
      local_20 = (StringBuilder *)std::__cxx11::string::c_str();
      local_18 = std::__cxx11::string::size();
      local_10 = local_18;
      goto LAB_0026c013;
    }
    if (TVar2 == Buf) {
      in_RDI->head = (char *)(in_RSI->field_0).str_;
      in_RDI->used = (in_RSI->field_0).buf_.used;
      in_RDI->size = (in_RSI->field_0).buf_.size;
      return in_RDI;
    }
  }
  local_10 = 0x3f;
  bVar1 = tag(in_RSI);
  local_18 = (size_t)(int)(0x3f - (uint)bVar1);
  local_20 = in_RSI;
LAB_0026c013:
  in_RDI->head = (char *)local_20;
  in_RDI->used = local_18;
  in_RDI->size = local_10;
  return in_RDI;
}

Assistant:

StringBuilder::Buffer StringBuilder::buffer() const {
	Buffer r;
	switch (type()) {
		default: assert(false);
		case Sbo: r.head = const_cast<char*>(sbo_); r.size = SboCap; r.used = SboCap - tag(); break;
		case Str: r.head = const_cast<char*>(str_->c_str()); r.size = r.used = str_->size();  break;
		case Buf: return buf_;
	}
	return r;
}